

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall OpenMesh::PolyConnectivity::triangulate(PolyConnectivity *this)

{
  FaceIter FVar1;
  FaceIter FVar2;
  FaceIter FVar3;
  undefined1 local_40 [8];
  FaceIter f_it;
  
  FVar2 = faces_begin(this);
  _local_40 = FVar2;
  FVar3 = faces_end(this);
  while ((BaseHandle)FVar2.hnd_.super_BaseHandle.idx_ !=
         (BaseHandle)FVar3.hnd_.super_BaseHandle.idx_ || FVar2.mesh_ != FVar3.mesh_) {
    triangulate(this,(FaceHandle)FVar2.hnd_.super_BaseHandle.idx_);
    Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_40);
    FVar1 = _local_40;
    FVar2.skip_bits_ = 0;
    FVar2.mesh_ = (mesh_ptr)local_40;
    FVar2.hnd_.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)f_it.mesh_._0_4_;
    _local_40 = FVar1;
  }
  return;
}

Assistant:

void PolyConnectivity::triangulate()
{
  /* The iterators will stay valid, even though new faces are added,
     because they are now implemented index-based instead of
     pointer-based.
  */
  FaceIter f_it(faces_begin()), f_end(faces_end());
  for (; f_it!=f_end; ++f_it)
    triangulate(*f_it);
}